

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectType.cpp
# Opt level: O3

int __thiscall DIS::ObjectType::getMarshalledSize(ObjectType *this)

{
  return 6;
}

Assistant:

int ObjectType::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = marshalSize + 1;  // _entityKind
   marshalSize = marshalSize + 1;  // _domain
   marshalSize = marshalSize + 2;  // _country
   marshalSize = marshalSize + 1;  // _category
   marshalSize = marshalSize + 1;  // _subcategory
    return marshalSize;
}